

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O1

void __thiscall
t_rb_generator::generate_field_constructors
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  undefined1 *puVar1;
  pointer pcVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  int iVar4;
  pointer pptVar5;
  string field_name;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8) {
    iVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"class << self",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (pptVar5 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
      }
      pcVar2 = ((*pptVar5)->name_)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + ((*pptVar5)->name_)._M_string_length);
      if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xf8) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar4 = iVar4 + 1;
        } while (iVar4 < *(int *)&(out->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"def ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(val)",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xf8) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar4 = iVar4 + 1;
        } while (iVar4 < *(int *)&(out->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,*(char **)CONCAT44(extraout_var,iVar4),
                          ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".new(:",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", val)",6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (0 < *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                       field_0xf8) {
        iVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
          iVar4 = iVar4 + 1;
        } while (iVar4 < *(int *)&(out->super_ofstream).
                                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar4 = *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                   field_0xf8;
  *(int *)&(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 =
       iVar4 + -1;
  if (1 < iVar4) {
    iVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"  ",2);
      iVar4 = iVar4 + 1;
    } while (iVar4 < *(int *)&(out->super_ofstream).
                              super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_rb_generator::generate_field_constructors(t_rb_ofstream& out, t_struct* tstruct) {

  out.indent() << "class << self" << endl;
  out.indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << endl;
    }
    std::string field_name = (*f_iter)->get_name();

    out.indent() << "def " << field_name << "(val)" << endl;
    out.indent() << "  " << tstruct->get_name() << ".new(:" << field_name << ", val)" << endl;
    out.indent() << "end" << endl;
  }

  out.indent_down();
  out.indent() << "end" << endl;

  out << endl;
}